

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

int __thiscall Parse::varDeclarationList(Parse *this)

{
  string *__args_2;
  int *piVar1;
  int iVar2;
  int iVar3;
  DelimiterTable *pDVar4;
  pointer pTVar5;
  SymbolTable *pSVar6;
  pointer pvVar7;
  int iVar8;
  Type TVar9;
  uint uVar10;
  mapped_type *pmVar11;
  long lVar12;
  ostream *poVar13;
  char *pcVar14;
  Parse *pPVar15;
  long lVar16;
  allocator local_169;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined8 local_148;
  _Bit_pointer puStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  string curName;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
    pDVar4 = this->delimiterTable;
    std::__cxx11::string::string((string *)local_168,",",(allocator *)&curName);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[](&(pDVar4->
                            super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).index,(key_type *)local_168);
    iVar8 = *pmVar11;
    iVar2 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[this->curIndex].id;
    std::__cxx11::string::~string((string *)local_168);
    if (iVar8 != iVar2) {
      if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
        pDVar4 = this->delimiterTable;
        std::__cxx11::string::string
                  ((string *)local_168,anon_var_dwarf_27e36 + 0x12,(allocator *)&curName);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&(pDVar4->
                                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).index,(key_type *)local_168);
        iVar8 = *pmVar11;
        iVar2 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                super__Vector_impl_data._M_start[this->curIndex].id;
        std::__cxx11::string::~string((string *)local_168);
        if (iVar8 == iVar2) {
          this->curIndex = this->curIndex + 1;
          return 1;
        }
      }
      goto LAB_00108f5c;
    }
    lVar12 = (long)this->curIndex + 1;
    this->curIndex = (int)lVar12;
    pTVar5 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pTVar5[lVar12].type == IDENTIFIER) {
      std::__cxx11::string::string((string *)&curName,(string *)&pTVar5[lVar12].name);
      pSVar6 = this->st;
      std::__cxx11::string::string
                ((string *)&local_d0,
                 (string *)
                 &(this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                  super__Vector_impl_data._M_start[this->curIndex].name);
      iVar8 = SymbolTable::searchSymbolName(pSVar6,&local_d0,this->curFun);
      std::__cxx11::string::~string((string *)&local_d0);
      if (iVar8 < 0) {
        this->curSymInd = this->curSymInd + 1;
        local_168._0_8_ = &local_158;
        uStack_130._0_4_ = 0;
        uStack_130._4_4_ = 0;
        local_128 = 0.0;
        local_148._0_4_ = 0;
        local_148._4_4_ = 0;
        puStack_140 = (_Bit_pointer)0x0;
        local_158._M_allocated_capacity = 0;
        local_158._8_8_ = 0;
        local_168._8_8_ = (_Bit_type *)0x0;
        local_138._0_4_ = 0;
        local_138._4_4_ = 0;
        uStack_120._0_1_ = false;
        uStack_120._1_1_ = true;
        uStack_120._2_6_ = 0;
        std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::
        emplace_back<SymbolTableElement>
                  ((this->st->symbolTable).
                   super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + this->curFun,
                   (SymbolTableElement *)local_168);
        std::__cxx11::string::~string((string *)local_168);
        pvVar7 = (this->st->symbolTable).
                 super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = *(long *)&pvVar7[this->curFun].
                           super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                           ._M_impl.super__Vector_impl_data;
        lVar16 = (long)((int)(((long)*(pointer *)
                                      ((long)&pvVar7[this->curFun].
                                              super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                                              ._M_impl.super__Vector_impl_data + 8) - lVar12) / 0x50
                             ) + -1) * 0x50;
        std::__cxx11::string::_M_assign((string *)(lVar12 + lVar16));
        *(undefined4 *)
         (*(long *)&(this->st->symbolTable).
                    super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                    _M_impl.super__Vector_impl_data + 0x24 + lVar16) = 3;
        lVar12 = (long)this->curIndex + 1;
        this->curIndex = (int)lVar12;
        if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar12].type == DELIMTER) {
          pDVar4 = this->delimiterTable;
          std::__cxx11::string::string((string *)local_168,"[",&local_169);
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&(pDVar4->
                                  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).index,(key_type *)local_168);
          iVar8 = *pmVar11;
          iVar2 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                  super__Vector_impl_data._M_start[this->curIndex].id;
          std::__cxx11::string::~string((string *)local_168);
          if (iVar8 == iVar2) {
            lVar12 = (long)this->curIndex + 1;
            this->curIndex = (int)lVar12;
            pTVar5 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if (pTVar5[lVar12].type != INTCONST) {
              poVar13 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_27da9);
              poVar13 = (ostream *)
                        std::ostream::operator<<
                                  (poVar13,(this->tokenVec->
                                           super__Vector_base<Token,_std::allocator<Token>_>).
                                           _M_impl.super__Vector_impl_data._M_start[this->curIndex].
                                           line);
              poVar13 = std::operator<<(poVar13,anon_var_dwarf_27d3a);
              std::endl<char,std::char_traits<char>>(poVar13);
              goto LAB_00108fa4;
            }
            std::__cxx11::string::string((string *)&local_f0,(string *)&pTVar5[lVar12].name);
            iVar8 = string2num<int>(&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            lVar12 = (long)this->curIndex + 1;
            this->curIndex = (int)lVar12;
            if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar12].type == DELIMTER) {
              pDVar4 = this->delimiterTable;
              std::__cxx11::string::string((string *)local_168,"]",&local_169);
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](&(pDVar4->
                                      super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).index,(key_type *)local_168);
              iVar2 = *pmVar11;
              iVar3 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                      super__Vector_impl_data._M_start[this->curIndex].id;
              std::__cxx11::string::~string((string *)local_168);
              if (iVar2 == iVar3) {
                this->curIndex = this->curIndex + 1;
                std::vector<QuadTuple,std::allocator<QuadTuple>>::
                emplace_back<char_const(&)[7],std::__cxx11::string&,char_const(&)[4],char_const(&)[3]>
                          ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,
                           (char (*) [7])"vardef",&curName,(char (*) [4])"arr",(char (*) [3])"__");
                local_148._0_4_ = 0;
                local_148._4_4_ = 0;
                puStack_140 = (_Bit_pointer)0x0;
                local_158._M_allocated_capacity = 0;
                local_158._8_8_ = 0;
                local_168._0_8_ = (pointer)0x0;
                local_168._8_8_ = (_Bit_type *)0x0;
                local_138._0_4_ = 0;
                local_138._4_4_ = 0;
                pPVar15 = (Parse *)&stack0xffffffffffffffb0;
                std::__cxx11::string::string((string *)pPVar15,(string *)&this->curType);
                TVar9 = toType(pPVar15,(string *)&stack0xffffffffffffffb0);
                local_138._0_4_ = TVar9;
                std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
                local_168._4_4_ = iVar8 + -1;
                pPVar15 = (Parse *)local_70;
                std::__cxx11::string::string((string *)pPVar15,(string *)&this->curType);
                uVar10 = typeSize(pPVar15,(string *)local_70);
                local_138._4_4_ = uVar10;
                std::__cxx11::string::~string((string *)local_70);
                for (uVar10 = local_168._0_4_; uVar10 <= (uint)local_168._4_4_; uVar10 = uVar10 + 1)
                {
                  std::vector<bool,_std::allocator<bool>_>::push_back
                            ((vector<bool,_std::allocator<bool>_> *)(local_168 + 8),true);
                }
                std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>::push_back
                          (&this->st->arrayTableVec,(value_type *)local_168);
                pSVar6 = this->st;
                lVar12 = *(long *)&(pSVar6->symbolTable).
                                   super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                                   super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                                   ._M_impl.super__Vector_impl_data;
                *(undefined4 *)(lVar12 + 0x20 + lVar16) = 5;
                *(int *)(lVar12 + 0x30 + lVar16) =
                     (int)(((long)(pSVar6->arrayTableVec).
                                  super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(pSVar6->arrayTableVec).
                                 super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>._M_impl.
                                 super__Vector_impl_data._M_start) / 0x38) + -1;
                *(uint *)(lVar12 + 0x2c + lVar16) = iVar8 * local_138._4_4_;
                std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                          ((_Bvector_base<std::allocator<bool>_> *)(local_168 + 8));
                goto LAB_00108f35;
              }
            }
            poVar13 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_27dcd);
            poVar13 = (ostream *)
                      std::ostream::operator<<
                                (poVar13,(this->tokenVec->
                                         super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                         super__Vector_impl_data._M_start[this->curIndex].line);
            poVar13 = std::operator<<(poVar13,anon_var_dwarf_27d3a);
            std::endl<char,std::char_traits<char>>(poVar13);
            goto LAB_00108fa4;
          }
        }
        __args_2 = &this->curType;
        std::vector<QuadTuple,std::allocator<QuadTuple>>::
        emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string&,char_const(&)[3]>
                  ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,
                   (char (*) [7])"vardef",&curName,__args_2,(char (*) [3])"--");
        pPVar15 = (Parse *)local_90;
        std::__cxx11::string::string((string *)pPVar15,(string *)__args_2);
        TVar9 = toType(pPVar15,(string *)local_90);
        *(Type *)(*(long *)&(this->st->symbolTable).
                            super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                            super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                            ._M_impl.super__Vector_impl_data + 0x20 + lVar16) = TVar9;
        std::__cxx11::string::~string((string *)local_90);
        *(int *)(*(long *)&(this->st->symbolTable).
                           super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                           super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                           ._M_impl.super__Vector_impl_data + 0x34 + lVar16) =
             (this->st->vallVec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[this->curFun];
        pPVar15 = (Parse *)local_b0;
        std::__cxx11::string::string((string *)pPVar15,(string *)__args_2);
        uVar10 = typeSize(pPVar15,(string *)local_b0);
        piVar1 = (this->st->vallVec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + this->curFun;
        *piVar1 = *piVar1 + uVar10;
        std::__cxx11::string::~string((string *)local_b0);
LAB_00108f35:
        varDeclarationList(this);
        std::__cxx11::string::~string((string *)&curName);
        return 1;
      }
      poVar13 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_757ae + 3);
      poVar13 = std::operator<<(poVar13,(string *)
                                        &(this->tokenVec->
                                         super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                         super__Vector_impl_data._M_start[this->curIndex].name);
      poVar13 = std::operator<<(poVar13,anon_var_dwarf_27d6c);
      poVar13 = std::operator<<(poVar13,anon_var_dwarf_280ac + 0x16);
      poVar13 = (ostream *)
                std::ostream::operator<<
                          (poVar13,(this->tokenVec->
                                   super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                   super__Vector_impl_data._M_start[this->curIndex].line);
      poVar13 = std::operator<<(poVar13,anon_var_dwarf_27d3a);
      std::endl<char,std::char_traits<char>>(poVar13);
      goto LAB_00108fa4;
    }
    pcVar14 = anon_var_dwarf_27d11;
  }
  else {
LAB_00108f5c:
    pcVar14 = anon_var_dwarf_27e36;
  }
  poVar13 = std::operator<<((ostream *)&std::cout,pcVar14);
  poVar13 = (ostream *)
            std::ostream::operator<<
                      (poVar13,(this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>).
                               _M_impl.super__Vector_impl_data._M_start[this->curIndex].line);
  poVar13 = std::operator<<(poVar13,anon_var_dwarf_27d3a);
  std::endl<char,std::char_traits<char>>(poVar13);
LAB_00108fa4:
  exit(0);
}

Assistant:

int Parse::varDeclarationList() {
    int index = curIndex;
    if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[","] == tokenVec[curIndex].id) {
        curIndex++;
            if(tokenVec[curIndex].type != TokenType::IDENTIFIER) {
                cout << "类型声明后必须跟着标识符在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            string curName = tokenVec[curIndex].name;
            int stIndex = 0;
            stIndex = st.searchSymbolName(tokenVec[curIndex].name, curFun);
            if(stIndex >= 0) {
//            cout << tokenVec[curIndex].name << endl;
                cout << "变量"<<  tokenVec[curIndex].name <<"重定义" << "在第" << tokenVec[curIndex].line  << "行" << endl;
                exit(0);
            }

            curSymInd++;
            st.symbolTable[curFun].emplace_back(SymbolTableElement());
            int symind = static_cast<int>(st.symbolTable[curFun].size() - 1);
            st.symbolTable[curFun][symind].name = curName;
            st.symbolTable[curFun][symind].cat = Category::VARIABLE;


            bool arrayFlag = false;
            curIndex++;
            int arrLen = 0;

            if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["["] == tokenVec[curIndex].id) {
                curIndex++;
                if(tokenVec[curIndex].type ==  INTCONST) {
                    arrLen = string2num<int >(tokenVec[curIndex].name);
                    curIndex++;
                } else {
                    cout << "数组长度必须是整型变量在第" << tokenVec[curIndex].line << "行" << endl;
                    exit(0);
                }
                if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["]"] == tokenVec[curIndex].id) {
                    curIndex++;
                } else {
                    cout << "数组声明缺少右括号在第" << tokenVec[curIndex].line << "行" << endl;
                    exit(0);
                }
                arrayFlag = true;
            }
            if(arrayFlag) {
                quadVec.emplace_back("vardef", curName, "arr", "__");
                ArrayInfo arrayInfoEle{};
                arrayInfoEle.low = 0;
                arrayInfoEle.type = toType(curType);
                arrayInfoEle.up = static_cast<unsigned int>(arrLen - 1);
                arrayInfoEle.clen = typeSize(curType);
                for(int ind = arrayInfoEle.low ; ind <= arrayInfoEle.up; ind++) {
                    arrayInfoEle.activeMess.push_back(true);
                }
                st.arrayTableVec.push_back(arrayInfoEle);
                st.symbolTable[curFun][symind].type = ARRAY;
                st.symbolTable[curFun][symind].aiInd = static_cast<int>(st.arrayTableVec.size() - 1);
                st.symbolTable[curFun][symind].len = arrayInfoEle.clen * arrLen;
            }else {
                quadVec.emplace_back("vardef", curName, curType, "--");
                st.symbolTable[curFun][symind].type = toType(curType);
                st.symbolTable[curFun][symind].vall = st.vallVec[curFun];
                st.vallVec[curFun] += typeSize(curType);
            }
            varDeclarationList();
    } else if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[";"] == tokenVec[curIndex].id) {
        curIndex++;
        return 1;
    } else {
        cout << "变量声明缺少;" << tokenVec[curIndex].line  << "行" << endl;
        exit(0);
    }
    return 1;
}